

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<void_(int,_mp::var::Type)>::~FunctionMockerBase
          (FunctionMockerBase<void_(int,_mp::var::Type)> *this)

{
  ~FunctionMockerBase(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }